

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionhandler.c
# Opt level: O0

OPTIONHANDLER_RESULT AddOptionInternal(OPTIONHANDLER_HANDLE handle,char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_2;
  OPTION temp;
  LOGGER_LOG l_1;
  void *cloneOfValue;
  LOGGER_LOG l;
  char *cloneOfName;
  void *pvStack_20;
  OPTIONHANDLER_RESULT result;
  void *value_local;
  char *name_local;
  OPTIONHANDLER_HANDLE handle_local;
  
  pvStack_20 = value;
  value_local = name;
  name_local = (char *)handle;
  iVar1 = mallocAndStrcpy_s((char **)&l,name);
  if (iVar1 == 0) {
    pcVar3 = (char *)(**(code **)name_local)(value_local,pvStack_20);
    if (pcVar3 == (char *)0x0) {
      temp.storage = xlogging_get_log_function();
      if ((LOGGER_LOG)temp.storage != (LOGGER_LOG)0x0) {
        (*(code *)temp.storage)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                   ,"AddOptionInternal",0x4c,1,"unable to clone value");
      }
      free(l);
      cloneOfName._4_4_ = OPTIONHANDLER_ERROR;
    }
    else {
      l_2 = l;
      temp.name = pcVar3;
      iVar1 = VECTOR_push_back(*(VECTOR_HANDLE *)(name_local + 0x18),&l_2,1);
      if (iVar1 == 0) {
        cloneOfName._4_4_ = OPTIONHANDLER_OK;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                    ,"AddOptionInternal",0x59,1,"unable to VECTOR_push_back");
        }
        (**(code **)(name_local + 8))(value_local,pcVar3);
        free(l);
        cloneOfName._4_4_ = OPTIONHANDLER_ERROR;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/optionhandler.c"
                ,"AddOptionInternal",0x42,1,"unable to clone name");
    }
    cloneOfName._4_4_ = OPTIONHANDLER_ERROR;
  }
  return cloneOfName._4_4_;
}

Assistant:

static OPTIONHANDLER_RESULT AddOptionInternal(OPTIONHANDLER_HANDLE handle, const char* name, const void* value)
{
    OPTIONHANDLER_RESULT result;
    const char* cloneOfName;
    if (mallocAndStrcpy_s((char**)&cloneOfName, name) != 0)
    {
        /*Codes_SRS_OPTIONHANDLER_02_009: [ Otherwise, OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_ERROR. ]*/
        LogError("unable to clone name");
        result = OPTIONHANDLER_ERROR;
    }
    else
    {
        /*Codes_SRS_OPTIONHANDLER_02_006: [ OptionHandler_AddProperty shall call pfCloneOption passing name and value. ]*/
        void* cloneOfValue = handle->cloneOption(name, value);
        if (cloneOfValue == NULL)
        {
            /*Codes_SRS_OPTIONHANDLER_02_009: [ Otherwise, OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_ERROR. ]*/
            LogError("unable to clone value");
            free((void*)cloneOfName);
            result = OPTIONHANDLER_ERROR;
        }
        else
        {
            OPTION temp;
            temp.name = cloneOfName;
            temp.storage = cloneOfValue;
            /*Codes_SRS_OPTIONHANDLER_02_007: [ OptionHandler_AddProperty shall use VECTOR APIs to save the name and the newly created clone of value. ]*/
            if (VECTOR_push_back(handle->storage, &temp, 1) != 0)
            {
                /*Codes_SRS_OPTIONHANDLER_02_009: [ Otherwise, OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_ERROR. ]*/
                LogError("unable to VECTOR_push_back");
                handle->destroyOption(name, cloneOfValue);
                free((void*)cloneOfName);
                result = OPTIONHANDLER_ERROR;
            }
            else
            {
                /*Codes_SRS_OPTIONHANDLER_02_008: [ If all the operations succed then OptionHandler_AddProperty shall succeed and return OPTIONHANDLER_OK. ]*/
                result = OPTIONHANDLER_OK;
            }
        }
    }

    return result;
}